

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCReaderGen_2x3.h
# Opt level: O1

void __thiscall
Assimp::IFC::Schema_2x3::IfcJunctionBoxType::IfcJunctionBoxType(IfcJunctionBoxType *this)

{
  *(undefined ***)&this->field_0x1e0 = &PTR__Object_00836880;
  *(undefined8 *)&this->field_0x1e8 = 0;
  *(char **)&this->field_0x1f0 = "IfcJunctionBoxType";
  Schema_2x3::IfcFlowFittingType::IfcFlowFittingType
            (&this->super_IfcFlowFittingType,&PTR_construction_vtable_24__00849310);
  *(undefined8 *)&(this->super_IfcFlowFittingType).field_0x1b8 = 0;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject =
       0x849190;
  *(undefined8 *)&this->field_0x1e0 = 0x8492f8;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0x88 = 0x8491b8;
  (this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
  super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcTypeObject,_2UL>._vptr_ObjectHelper =
       (_func_int **)0x8491e0;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.super_IfcTypeObject.
    field_0xf0 = 0x849208;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.super_IfcTypeProduct.field_0x148 =
       0x849230;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x180 = 0x849258;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.super_IfcElementType.field_0x190 = 0x849280;
  *(undefined8 *)
   &(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.
    super_IfcDistributionElementType.field_0x1a0 = 0x8492a8;
  *(undefined8 *)&(this->super_IfcFlowFittingType).super_IfcDistributionFlowElementType.field_0x1b0
       = 0x8492d0;
  *(undefined1 **)&(this->super_IfcFlowFittingType).field_0x1c0 = &this->field_0x1d0;
  *(undefined8 *)&this->field_0x1c8 = 0;
  this->field_0x1d0 = 0;
  return;
}

Assistant:

IfcJunctionBoxType() : Object("IfcJunctionBoxType") {}